

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_segment_suite.cpp
# Opt level: O1

void data_suite::segment_empty(void)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  segment sVar4;
  initializer_list<int> __l;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  allocator_type local_81;
  circular_view<int,_18446744073709551615UL> local_80;
  vector<int,_std::allocator<int>_> local_60;
  int local_48 [10];
  
  local_80.member.data = local_48 + 4;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[6] = 0;
  local_48[7] = 0;
  local_80.member.cap = 4;
  local_80.member.size = 0;
  local_80.member.next = 4;
  sVar4 = vista::circular_view<int,_18446744073709551615UL>::first_segment(&local_80);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xbf,"void data_suite::segment_empty()",sVar4.member.head,sVar4.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  sVar4 = vista::circular_view<int,_18446744073709551615UL>::last_segment(&local_80);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xc6,"void data_suite::segment_empty()",sVar4.member.head,sVar4.member.tail,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  piVar3 = (int *)0x0;
  piVar2 = (int *)0x0;
  if (local_80.member.size != local_80.member.cap) {
    piVar2 = local_80.member.data + (local_80.member.next - local_80.member.cap);
    uVar1 = local_80.member.next - local_80.member.size;
    if (local_80.member.cap < local_80.member.next - local_80.member.size) {
      uVar1 = local_80.member.cap;
    }
    piVar3 = local_80.member.data + uVar1;
  }
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  __l._M_len = 4;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,&local_81);
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xcd,"void data_suite::segment_empty()",piVar2,piVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  piVar3 = (int *)0x0;
  piVar2 = (int *)0x0;
  if (local_80.member.size != local_80.member.cap) {
    uVar1 = local_80.member.next - local_80.member.size;
    piVar3 = (int *)0x0;
    piVar2 = (int *)0x0;
    if (local_80.member.cap < uVar1) {
      if ((local_80.member.cap & local_80.member.cap - 1) == 0) {
        uVar1 = uVar1 & local_80.member.cap - 1;
      }
      else {
        uVar1 = uVar1 % local_80.member.cap;
      }
      piVar3 = local_80.member.data + uVar1;
      piVar2 = local_80.member.data;
    }
  }
  boost::detail::
  test_all_eq_impl<std::ostream,int*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_segment_suite.cpp"
             ,0xd4,"void data_suite::segment_empty()",piVar2,piVar3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)0x0);
  return;
}

Assistant:

void segment_empty()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        auto segment = span.first_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.first_unused_segment();

        std::vector<int> expect = { 0, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
    {
        auto segment = span.last_unused_segment();

        std::vector<int> expect = { };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}